

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TtfUtil.cpp
# Opt level: O2

bool TtfUtil::GetComponentTransform
               (void *pSimpleGlyf,int nCompId,float *flt11,float *flt12,float *flt21,float *flt22,
               bool *fTransOffset)

{
  ushort uVar1;
  ushort uVar2;
  ulong uVar3;
  ushort *puVar4;
  bool bVar5;
  bool bVar6;
  float fVar7;
  
  if ((*pSimpleGlyf & 0x80) == 0) {
    return false;
  }
  puVar4 = (ushort *)((long)pSimpleGlyf + 10);
  do {
    uVar2 = *puVar4;
    uVar1 = uVar2 >> 8;
    bVar6 = (uint)(ushort)(puVar4[1] << 8 | puVar4[1] >> 8) == nCompId;
    if (bVar6) {
      uVar3 = (ulong)(uVar1 & 1);
      if (*fTransOffset == true) {
        bVar5 = ((ushort)(uVar2 << 8) >> 0xc & 1) == 0;
      }
      else {
        bVar5 = (bool)((byte)uVar2 >> 3 & 1);
      }
      *fTransOffset = bVar5;
      if ((uVar1 & 8) != 0) {
        *flt11 = (float)(ushort)(puVar4[uVar3 + 3] << 8 | puVar4[uVar3 + 3] >> 8) * 6.1035156e-05;
        *flt12 = 0.0;
        *flt21 = 0.0;
        fVar7 = *flt11;
        goto LAB_0010ad9b;
      }
      if ((uVar1 & 0x40) == 0) {
        if (-1 < (short)uVar2) goto LAB_0010ac81;
        *flt11 = (float)(ushort)(puVar4[uVar3 + 3] << 8 | puVar4[uVar3 + 3] >> 8) * 6.1035156e-05;
        *flt12 = (float)(ushort)(puVar4[uVar3 + 4] << 8 | puVar4[uVar3 + 4] >> 8) * 6.1035156e-05;
        *flt21 = (float)(ushort)(puVar4[uVar3 + 5] << 8 | puVar4[uVar3 + 5] >> 8) * 6.1035156e-05;
        uVar2 = puVar4[uVar3 + 6];
      }
      else {
        *flt11 = (float)(ushort)(puVar4[uVar3 + 3] << 8 | puVar4[uVar3 + 3] >> 8) * 6.1035156e-05;
        *flt12 = 0.0;
        *flt21 = 0.0;
        uVar2 = puVar4[uVar3 + 4];
      }
      fVar7 = (float)(ushort)(uVar2 << 8 | uVar2 >> 8) * 6.1035156e-05;
      goto LAB_0010ad9b;
    }
    puVar4 = (ushort *)
             ((long)puVar4 + (ulong)((uVar2 >> 0xc & 0xc | uVar2 >> 10 & 2) + (uVar1 & 1) * 2) + 6);
  } while ((uVar1 & 0x20) != 0);
  *fTransOffset = false;
LAB_0010ac81:
  *flt11 = 1.0;
  *flt12 = 0.0;
  *flt21 = 0.0;
  fVar7 = 1.0;
LAB_0010ad9b:
  *flt22 = fVar7;
  return bVar6;
}

Assistant:

bool GetComponentTransform(const void * pSimpleGlyf, int nCompId, 
									float & flt11, float & flt12, float & flt21, float & flt22, 
									bool & fTransOffset)
{
	using namespace Sfnt;
	
	if (GlyfContourCount(pSimpleGlyf) >= 0)
		return false;

	const Sfnt::SimpleGlyph * pGlyph = reinterpret_cast<const Sfnt::SimpleGlyph *>(pSimpleGlyf);
	// for a composite glyph, the special data begins here
	const uint8 * pbGlyph = reinterpret_cast<const uint8 *>(&pGlyph->end_pts_of_contours[0]);

	uint16 GlyphFlags;
	do 
	{
		GlyphFlags = read(*((uint16 *)pbGlyph));
		pbGlyph += sizeof(uint16);
		if (read(*((uint16 *)pbGlyph)) == nCompId)
		{
			pbGlyph += sizeof(uint16); // skip over glyph id of component
			pbGlyph += GlyphFlags & CompoundGlyph::Arg1Arg2Words  ? 4 : 2; // skip over placement data

			if (fTransOffset) // MS rasterizer
				fTransOffset = !(GlyphFlags & CompoundGlyph::UnscaledOffset); 
			else // Apple rasterizer
				fTransOffset = (GlyphFlags & CompoundGlyph::ScaledOffset) != 0;

			if (GlyphFlags & CompoundGlyph::HaveScale)
			{
				flt11 = fixed_to_float<14>(read(*(uint16 *)pbGlyph));
				pbGlyph += sizeof(uint16);
				flt12 = 0;
				flt21 = 0;
				flt22 = flt11;
			}
			else if (GlyphFlags & CompoundGlyph::HaveXAndYScale)
			{
				flt11 = fixed_to_float<14>(read(*(uint16 *)pbGlyph));
				pbGlyph += sizeof(uint16);
				flt12 = 0;
				flt21 = 0;
				flt22 = fixed_to_float<14>(read(*(uint16 *)pbGlyph));
				pbGlyph += sizeof(uint16);
			}
			else if (GlyphFlags & CompoundGlyph::HaveTwoByTwo)
			{
				flt11 = fixed_to_float<14>(read(*(uint16 *)pbGlyph));
				pbGlyph += sizeof(uint16);
				flt12 = fixed_to_float<14>(read(*(uint16 *)pbGlyph));
				pbGlyph += sizeof(uint16);
				flt21 = fixed_to_float<14>(read(*(uint16 *)pbGlyph));
				pbGlyph += sizeof(uint16);
				flt22 = fixed_to_float<14>(read(*(uint16 *)pbGlyph));
				pbGlyph += sizeof(uint16);
			}
			else
			{ // identity transform
				flt11 = 1.0;
				flt12 = 0.0;
				flt21 = 0.0;
				flt22 = 1.0;
			}
			return true;
		}
		pbGlyph += sizeof(uint16); // skip over glyph id of component
		int nOffset = 0;
		nOffset += GlyphFlags & CompoundGlyph::Arg1Arg2Words  ? 4 : 2;
		nOffset += GlyphFlags & CompoundGlyph::HaveScale ? 2 : 0;
		nOffset += GlyphFlags & CompoundGlyph::HaveXAndYScale  ? 4 : 0;
		nOffset += GlyphFlags & CompoundGlyph::HaveTwoByTwo  ? 8 :  0;
		pbGlyph += nOffset;
	} while (GlyphFlags & CompoundGlyph::MoreComponents);

	// didn't find requested component
	fTransOffset = false;
	flt11 = 1;
	flt12 = 0;
	flt21 = 0;
	flt22 = 1;
	return false;
}